

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

void basic_tests(void)

{
  bool bVar1;
  version vVar2;
  wostream *pwVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  long lVar5;
  token_type tVar6;
  initializer_list<mjs::token> __l;
  initializer_list<mjs::token> __l_00;
  initializer_list<mjs::token> __l_01;
  initializer_list<mjs::token> __l_02;
  initializer_list<mjs::token> __l_03;
  initializer_list<mjs::token> __l_04;
  initializer_list<mjs::token> __l_05;
  initializer_list<mjs::token> __l_06;
  initializer_list<mjs::token> __l_07;
  initializer_list<mjs::token> __l_08;
  initializer_list<mjs::token> __l_09;
  initializer_list<mjs::token> __l_10;
  initializer_list<mjs::token> __l_11;
  initializer_list<mjs::token> __l_12;
  initializer_list<mjs::token> __l_13;
  initializer_list<mjs::token> __l_14;
  initializer_list<mjs::token> __l_15;
  initializer_list<mjs::token> __l_16;
  initializer_list<mjs::token> __l_17;
  initializer_list<mjs::token> __l_18;
  initializer_list<mjs::token> __l_19;
  initializer_list<mjs::token> __l_20;
  initializer_list<mjs::token> __l_21;
  initializer_list<mjs::token> __l_22;
  initializer_list<mjs::token> __l_23;
  initializer_list<mjs::token> __l_24;
  initializer_list<mjs::token> __l_25;
  initializer_list<mjs::token> __l_26;
  initializer_list<mjs::token> __l_27;
  initializer_list<mjs::token> __l_28;
  initializer_list<mjs::token> __l_29;
  initializer_list<mjs::token> __l_30;
  initializer_list<mjs::token> __l_31;
  initializer_list<mjs::token> __l_32;
  initializer_list<mjs::token> __l_33;
  initializer_list<mjs::token> __l_34;
  initializer_list<mjs::token> __l_35;
  initializer_list<mjs::token> __l_36;
  initializer_list<mjs::token> __l_37;
  initializer_list<mjs::token> __l_38;
  vector<mjs::token,_std::allocator<mjs::token>_> _l;
  vector<mjs::token,_std::allocator<mjs::token>_> _l_1;
  vector<mjs::token,_std::allocator<mjs::token>_> _r;
  allocator_type local_314;
  allocator<wchar_t> local_313;
  allocator<wchar_t> local_312;
  allocator<wchar_t> local_311;
  vector<mjs::token,_std::allocator<mjs::token>_> _r_11;
  vector<mjs::token,_std::allocator<mjs::token>_> _l_11;
  undefined1 local_2e0 [8];
  anon_union_32_3_e608ca2d_for_token_1 local_2d8;
  token local_2b8;
  token local_290;
  undefined4 local_268;
  undefined8 local_260;
  token local_240;
  token_type local_218;
  token local_1f0;
  undefined4 local_1c8;
  token local_1a0;
  undefined4 local_178;
  undefined4 local_150;
  token local_128;
  undefined4 local_100;
  undefined4 local_d8;
  undefined4 local_b0;
  string local_88;
  string local_68;
  string local_48;
  
  local_2e0 = (undefined1  [8])0x7;
  local_2d8.dvalue_ = 7.69479575721574e-318;
  lex(&_l,(wstring_view *)local_2e0);
  local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&_l_1,L"ab",(allocator<wchar_t> *)&_l_11);
  mjs::token::token(&local_2b8,identifier,(wstring *)&_l_1);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2e0;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&_r,__l,(allocator_type *)&_r_11);
  lVar5 = 0x28;
  do {
    mjs::token::destroy((token *)(local_2e0 + lVar5));
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x28);
  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
  bVar1 = std::operator!=(&_l,&_r);
  if (bVar1) {
    pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
    pwVar3 = std::operator<<(pwVar3," in ");
    pwVar3 = std::operator<<(pwVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar3 = std::operator<<(pwVar3,":");
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x33);
    pwVar3 = std::operator<<(pwVar3,":\n");
    pwVar3 = std::operator<<(pwVar3,"lex(L\"\\x09\\x0b\\x0c\\x20 ab\")");
    pwVar3 = std::operator<<(pwVar3," != ");
    pwVar3 = std::operator<<(pwVar3,
                             "TOKENS(token{token_type::whitespace}, token{token_type::identifier, L\"ab\"})"
                            );
    pwVar3 = std::operator<<(pwVar3,"\n");
    pbVar4 = operator<<(pwVar3,&_l);
    pwVar3 = std::operator<<(pbVar4," != ");
    pbVar4 = operator<<(pwVar3,&_r);
    pwVar3 = std::operator<<(pbVar4,"\n");
    vVar2 = tested_version();
    pbVar4 = mjs::operator<<(pwVar3,vVar2);
    std::operator<<(pbVar4,"\n");
  }
  else {
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
    vVar2 = tested_version();
    if (0 < (int)vVar2) {
      local_2e0 = (undefined1  [8])0x3;
      local_2d8.dvalue_ = 7.69495385822241e-318;
      lex(&_l_1,(wstring_view *)local_2e0);
      local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_2e0;
      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&_l,__l_00,(allocator_type *)&_r)
      ;
      mjs::token::destroy((token *)local_2e0);
      bVar1 = std::operator!=(&_l_1,&_l);
      if (bVar1) {
        pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
        pwVar3 = std::operator<<(pwVar3," in ");
        pwVar3 = std::operator<<(pwVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                );
        pwVar3 = std::operator<<(pwVar3,":");
        pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x36);
        pwVar3 = std::operator<<(pwVar3,":\n");
        pwVar3 = std::operator<<(pwVar3,"lex(L\"\\xA0\\x1680\\x2000\")");
        pwVar3 = std::operator<<(pwVar3," != ");
        pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::whitespace})");
        pwVar3 = std::operator<<(pwVar3,"\n");
        pbVar4 = operator<<(pwVar3,&_l_1);
        pwVar3 = std::operator<<(pbVar4," != ");
        pbVar4 = operator<<(pwVar3,&_l);
        pwVar3 = std::operator<<(pbVar4,"\n");
        vVar2 = tested_version();
        pbVar4 = mjs::operator<<(pwVar3,vVar2);
        std::operator<<(pbVar4,"\n");
        goto LAB_001164d0;
      }
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
    }
    local_2e0 = (undefined1  [8])0x3;
    local_2d8.dvalue_ = 7.69503290872575e-318;
    lex(&_l,(wstring_view *)local_2e0);
    local_2e0._0_4_ = 1;
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&_l_1,L"x",(allocator<wchar_t> *)&_l_11);
    mjs::token::token(&local_2b8,identifier,(wstring *)&_l_1);
    local_290.type_ = line_terminator;
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)local_2e0;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              (&_r,__l_01,(allocator_type *)&_r_11);
    lVar5 = 0x50;
    do {
      mjs::token::destroy((token *)(local_2e0 + lVar5));
      lVar5 = lVar5 + -0x28;
    } while (lVar5 != -0x28);
    std::__cxx11::wstring::~wstring((wstring *)&_l_1);
    bVar1 = std::operator!=(&_l,&_r);
    if (bVar1) {
      pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
      pwVar3 = std::operator<<(pwVar3," in ");
      pwVar3 = std::operator<<(pwVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar3 = std::operator<<(pwVar3,":");
      pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x39);
      pwVar3 = std::operator<<(pwVar3,":\n");
      pwVar3 = std::operator<<(pwVar3,"lex(L\"\\012x\\015\")");
      pwVar3 = std::operator<<(pwVar3," != ");
      pwVar3 = std::operator<<(pwVar3,
                               "TOKENS(token{token_type::line_terminator}, token{token_type::identifier, L\"x\"}, token{token_type::line_terminator})"
                              );
      pwVar3 = std::operator<<(pwVar3,"\n");
      pbVar4 = operator<<(pwVar3,&_l);
      pwVar3 = std::operator<<(pbVar4," != ");
      pbVar4 = operator<<(pwVar3,&_r);
      pwVar3 = std::operator<<(pbVar4,"\n");
      vVar2 = tested_version();
      pbVar4 = mjs::operator<<(pwVar3,vVar2);
      std::operator<<(pbVar4,"\n");
    }
    else {
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
      vVar2 = tested_version();
      if (0 < (int)vVar2) {
        local_2e0 = (undefined1  [8])0x2;
        local_2d8.dvalue_ = 7.69511195922908e-318;
        lex(&_l_1,(wstring_view *)local_2e0);
        local_2e0._0_4_ = 1;
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)local_2e0;
        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                  (&_l,__l_02,(allocator_type *)&_r);
        mjs::token::destroy((token *)local_2e0);
        bVar1 = std::operator!=(&_l_1,&_l);
        if (bVar1) {
          pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
          pwVar3 = std::operator<<(pwVar3," in ");
          pwVar3 = std::operator<<(pwVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                  );
          pwVar3 = std::operator<<(pwVar3,":");
          pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x3c);
          pwVar3 = std::operator<<(pwVar3,":\n");
          pwVar3 = std::operator<<(pwVar3,"lex(L\"\\x2028\\x2029\")");
          pwVar3 = std::operator<<(pwVar3," != ");
          pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::line_terminator})");
          pwVar3 = std::operator<<(pwVar3,"\n");
          pbVar4 = operator<<(pwVar3,&_l_1);
          pwVar3 = std::operator<<(pbVar4," != ");
          pbVar4 = operator<<(pwVar3,&_l);
          pwVar3 = std::operator<<(pbVar4,"\n");
          vVar2 = tested_version();
          pbVar4 = mjs::operator<<(pwVar3,vVar2);
          std::operator<<(pbVar4,"\n");
          goto LAB_001164d0;
        }
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
        local_2e0 = (undefined1  [8])0x4;
        local_2d8.dvalue_ = 7.69517124710658e-318;
        lex(&_l,(wstring_view *)local_2e0);
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)&_l_1,L"x",(allocator<wchar_t> *)&_l_11);
        mjs::token::token((token *)local_2e0,identifier,(wstring *)&_l_1);
        local_2b8.type_ = whitespace;
        local_290.type_ = line_terminator;
        __l_03._M_len = 3;
        __l_03._M_array = (iterator)local_2e0;
        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                  (&_r,__l_03,(allocator_type *)&_r_11);
        lVar5 = 0x50;
        do {
          mjs::token::destroy((token *)(local_2e0 + lVar5));
          lVar5 = lVar5 + -0x28;
        } while (lVar5 != -0x28);
        std::__cxx11::wstring::~wstring((wstring *)&_l_1);
        bVar1 = std::operator!=(&_l,&_r);
        if (bVar1) {
          pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
          pwVar3 = std::operator<<(pwVar3," in ");
          pwVar3 = std::operator<<(pwVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                  );
          pwVar3 = std::operator<<(pwVar3,":");
          pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x3d);
          pwVar3 = std::operator<<(pwVar3,":\n");
          pwVar3 = std::operator<<(pwVar3,"lex(L\"x//\\x2029\")");
          pwVar3 = std::operator<<(pwVar3," != ");
          pwVar3 = std::operator<<(pwVar3,
                                   "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace}, token{token_type::line_terminator})"
                                  );
          pwVar3 = std::operator<<(pwVar3,"\n");
          pbVar4 = operator<<(pwVar3,&_l);
          pwVar3 = std::operator<<(pbVar4," != ");
          pbVar4 = operator<<(pwVar3,&_r);
          pwVar3 = std::operator<<(pbVar4,"\n");
          vVar2 = tested_version();
          pbVar4 = mjs::operator<<(pwVar3,vVar2);
          std::operator<<(pbVar4,"\n");
          goto LAB_001164d0;
        }
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
      }
      local_2e0 = (undefined1  [8])0x10;
      local_2d8.dvalue_ = 7.69527006023575e-318;
      lex(&_l_1,(wstring_view *)local_2e0);
      local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)local_2e0;
      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&_l,__l_04,(allocator_type *)&_r)
      ;
      mjs::token::destroy((token *)local_2e0);
      bVar1 = std::operator!=(&_l_1,&_l);
      if (bVar1) {
        pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
        pwVar3 = std::operator<<(pwVar3," in ");
        pwVar3 = std::operator<<(pwVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                );
        pwVar3 = std::operator<<(pwVar3,":");
        pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x40);
        pwVar3 = std::operator<<(pwVar3,":\n");
        pwVar3 = std::operator<<(pwVar3,"lex(L\"/*hello world!*/\")");
        pwVar3 = std::operator<<(pwVar3," != ");
        pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::whitespace})");
        pwVar3 = std::operator<<(pwVar3,"\n");
        pbVar4 = operator<<(pwVar3,&_l_1);
        pwVar3 = std::operator<<(pbVar4," != ");
        pbVar4 = operator<<(pwVar3,&_l);
        pwVar3 = std::operator<<(pbVar4,"\n");
        vVar2 = tested_version();
        pbVar4 = mjs::operator<<(pwVar3,vVar2);
        std::operator<<(pbVar4,"\n");
      }
      else {
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
        local_2e0 = (undefined1  [8])0x10;
        local_2d8.dvalue_ = 7.69560602487492e-318;
        lex(&_l_1,(wstring_view *)local_2e0);
        local_2e0._0_4_ = 1;
        __l_05._M_len = 1;
        __l_05._M_array = (iterator)local_2e0;
        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                  (&_l,__l_05,(allocator_type *)&_r);
        mjs::token::destroy((token *)local_2e0);
        bVar1 = std::operator!=(&_l_1,&_l);
        if (bVar1) {
          pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
          pwVar3 = std::operator<<(pwVar3," in ");
          pwVar3 = std::operator<<(pwVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                  );
          pwVar3 = std::operator<<(pwVar3,":");
          pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x41);
          pwVar3 = std::operator<<(pwVar3,":\n");
          pwVar3 = std::operator<<(pwVar3,"lex(L\"/*hello\\nworld!*/\")");
          pwVar3 = std::operator<<(pwVar3," != ");
          pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::line_terminator})");
          pwVar3 = std::operator<<(pwVar3,"\n");
          pbVar4 = operator<<(pwVar3,&_l_1);
          pwVar3 = std::operator<<(pbVar4," != ");
          pbVar4 = operator<<(pwVar3,&_l);
          pwVar3 = std::operator<<(pbVar4,"\n");
          vVar2 = tested_version();
          pbVar4 = mjs::operator<<(pwVar3,vVar2);
          std::operator<<(pbVar4,"\n");
        }
        else {
          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
          local_2e0 = (undefined1  [8])0x7;
          local_2d8.dvalue_ = 7.6959419895141e-318;
          lex(&_l,(wstring_view *)local_2e0);
          std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                    ((wstring *)&_l_1,L"x",(allocator<wchar_t> *)&_l_11);
          mjs::token::token((token *)local_2e0,identifier,(wstring *)&_l_1);
          local_2b8.type_ = whitespace;
          __l_06._M_len = 2;
          __l_06._M_array = (iterator)local_2e0;
          std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                    (&_r,__l_06,(allocator_type *)&_r_11);
          lVar5 = 0x28;
          do {
            mjs::token::destroy((token *)(local_2e0 + lVar5));
            lVar5 = lVar5 + -0x28;
          } while (lVar5 != -0x28);
          std::__cxx11::wstring::~wstring((wstring *)&_l_1);
          bVar1 = std::operator!=(&_l,&_r);
          if (bVar1) {
            pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
            pwVar3 = std::operator<<(pwVar3," in ");
            pwVar3 = std::operator<<(pwVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                    );
            pwVar3 = std::operator<<(pwVar3,":");
            pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x42);
            pwVar3 = std::operator<<(pwVar3,":\n");
            pwVar3 = std::operator<<(pwVar3,"lex(L\"x//test\")");
            pwVar3 = std::operator<<(pwVar3," != ");
            pwVar3 = std::operator<<(pwVar3,
                                     "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace})"
                                    );
            pwVar3 = std::operator<<(pwVar3,"\n");
            pbVar4 = operator<<(pwVar3,&_l);
            pwVar3 = std::operator<<(pbVar4," != ");
            pbVar4 = operator<<(pwVar3,&_r);
            pwVar3 = std::operator<<(pbVar4,"\n");
            vVar2 = tested_version();
            pbVar4 = mjs::operator<<(pwVar3,vVar2);
            std::operator<<(pbVar4,"\n");
          }
          else {
            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
            local_2e0 = (undefined1  [8])0x8;
            local_2d8.dvalue_ = 7.69610009052076e-318;
            lex(&_l,(wstring_view *)local_2e0);
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                      ((wstring *)&_l_1,L"x",(allocator<wchar_t> *)&_l_11);
            mjs::token::token((token *)local_2e0,identifier,(wstring *)&_l_1);
            local_2b8.type_ = whitespace;
            local_290.type_ = line_terminator;
            __l_07._M_len = 3;
            __l_07._M_array = (iterator)local_2e0;
            std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                      (&_r,__l_07,(allocator_type *)&_r_11);
            lVar5 = 0x50;
            do {
              mjs::token::destroy((token *)(local_2e0 + lVar5));
              lVar5 = lVar5 + -0x28;
            } while (lVar5 != -0x28);
            std::__cxx11::wstring::~wstring((wstring *)&_l_1);
            bVar1 = std::operator!=(&_l,&_r);
            if (bVar1) {
              pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
              pwVar3 = std::operator<<(pwVar3," in ");
              pwVar3 = std::operator<<(pwVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                      );
              pwVar3 = std::operator<<(pwVar3,":");
              pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x43);
              pwVar3 = std::operator<<(pwVar3,":\n");
              pwVar3 = std::operator<<(pwVar3,"lex(L\"x//test\\n\")");
              pwVar3 = std::operator<<(pwVar3," != ");
              pwVar3 = std::operator<<(pwVar3,
                                       "TOKENS(token{token_type::identifier, L\"x\"}, token{token_type::whitespace}, token{token_type::line_terminator})"
                                      );
              pwVar3 = std::operator<<(pwVar3,"\n");
              pbVar4 = operator<<(pwVar3,&_l);
              pwVar3 = std::operator<<(pbVar4," != ");
              pbVar4 = operator<<(pwVar3,&_r);
              pwVar3 = std::operator<<(pbVar4,"\n");
              vVar2 = tested_version();
              pbVar4 = mjs::operator<<(pwVar3,vVar2);
              std::operator<<(pbVar4,"\n");
            }
            else {
              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
              local_2e0 = (undefined1  [8])0x3;
              local_2d8.dvalue_ = 7.69627795415327e-318;
              lex(&_l_1,(wstring_view *)local_2e0);
              local_2e0._0_4_ = 0x4c;
              __l_08._M_len = 1;
              __l_08._M_array = (iterator)local_2e0;
              std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                        (&_l,__l_08,(allocator_type *)&_r);
              mjs::token::destroy((token *)local_2e0);
              bVar1 = std::operator!=(&_l_1,&_l);
              if (bVar1) {
                pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                pwVar3 = std::operator<<(pwVar3," in ");
                pwVar3 = std::operator<<(pwVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                        );
                pwVar3 = std::operator<<(pwVar3,":");
                pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x45);
                pwVar3 = std::operator<<(pwVar3,":\n");
                pwVar3 = std::operator<<(pwVar3,"lex(LR\"(for)\")");
                pwVar3 = std::operator<<(pwVar3," != ");
                pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::for_})");
                pwVar3 = std::operator<<(pwVar3,"\n");
                pbVar4 = operator<<(pwVar3,&_l_1);
                pwVar3 = std::operator<<(pbVar4," != ");
                pbVar4 = operator<<(pwVar3,&_l);
                pwVar3 = std::operator<<(pbVar4,"\n");
                vVar2 = tested_version();
                pbVar4 = mjs::operator<<(pwVar3,vVar2);
                std::operator<<(pbVar4,"\n");
              }
              else {
                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                local_2e0 = (undefined1  [8])0x4;
                local_2d8.ivalue_ = 0x17c4b8;
                lex(&_l,(wstring_view *)local_2e0);
                std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                          ((wstring *)&_l_1,L"test",(allocator<wchar_t> *)&_l_11);
                mjs::token::token((token *)local_2e0,identifier,(wstring *)&_l_1);
                __l_09._M_len = 1;
                __l_09._M_array = (iterator)local_2e0;
                std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                          (&_r,__l_09,(allocator_type *)&_r_11);
                mjs::token::destroy((token *)local_2e0);
                std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                bVar1 = std::operator!=(&_l,&_r);
                if (bVar1) {
                  pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                  pwVar3 = std::operator<<(pwVar3," in ");
                  pwVar3 = std::operator<<(pwVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                          );
                  pwVar3 = std::operator<<(pwVar3,":");
                  pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x47);
                  pwVar3 = std::operator<<(pwVar3,":\n");
                  pwVar3 = std::operator<<(pwVar3,"lex(LR\"(test)\")");
                  pwVar3 = std::operator<<(pwVar3," != ");
                  pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::identifier, L\"test\"})"
                                          );
                  pwVar3 = std::operator<<(pwVar3,"\n");
                  pbVar4 = operator<<(pwVar3,&_l);
                  pwVar3 = std::operator<<(pbVar4," != ");
                  pbVar4 = operator<<(pwVar3,&_r);
                  pwVar3 = std::operator<<(pbVar4,"\n");
                  vVar2 = tested_version();
                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                  std::operator<<(pbVar4,"\n");
                }
                else {
                  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
                  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                  local_2e0 = (undefined1  [8])0x6;
                  local_2d8.dvalue_ = 7.6963570046566e-318;
                  lex(&_l_11,(wstring_view *)local_2e0);
                  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                            ((wstring *)&_l_1,L"a",&local_311);
                  mjs::token::token((token *)local_2e0,identifier,(wstring *)&_l_1);
                  local_2b8.type_ = whitespace;
                  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                            ((wstring *)&_l,L"b",&local_312);
                  mjs::token::token(&local_290,identifier,(wstring *)&_l);
                  local_268 = 0;
                  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                            ((wstring *)&_r,L"cd",&local_313);
                  mjs::token::token(&local_240,identifier,(wstring *)&_r);
                  __l_10._M_len = 5;
                  __l_10._M_array = (iterator)local_2e0;
                  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                            (&_r_11,__l_10,&local_314);
                  lVar5 = 0xa0;
                  do {
                    mjs::token::destroy((token *)(local_2e0 + lVar5));
                    lVar5 = lVar5 + -0x28;
                  } while (lVar5 != -0x28);
                  std::__cxx11::wstring::~wstring((wstring *)&_r);
                  std::__cxx11::wstring::~wstring((wstring *)&_l);
                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                  bVar1 = std::operator!=(&_l_11,&_r_11);
                  if (bVar1) {
                    pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                    pwVar3 = std::operator<<(pwVar3," in ");
                    pwVar3 = std::operator<<(pwVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                            );
                    pwVar3 = std::operator<<(pwVar3,":");
                    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x48);
                    pwVar3 = std::operator<<(pwVar3,":\n");
                    pwVar3 = std::operator<<(pwVar3,"lex(L\"a b cd\")");
                    pwVar3 = std::operator<<(pwVar3," != ");
                    pwVar3 = std::operator<<(pwVar3,
                                             "TOKENS(token{token_type::identifier, L\"a\"}, token{token_type::whitespace}, token{token_type::identifier, L\"b\"}, token{token_type::whitespace}, token{token_type::identifier, L\"cd\"})"
                                            );
                    pwVar3 = std::operator<<(pwVar3,"\n");
                    pbVar4 = operator<<(pwVar3,&_l_11);
                    pwVar3 = std::operator<<(pbVar4," != ");
                    pbVar4 = operator<<(pwVar3,&_r_11);
                    pwVar3 = std::operator<<(pbVar4,"\n");
                    vVar2 = tested_version();
                    pbVar4 = mjs::operator<<(pwVar3,vVar2);
                    std::operator<<(pbVar4,"\n");
                  }
                  else {
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r_11);
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_11);
                    local_2e0 = (undefined1  [8])0xa;
                    local_2d8.dvalue_ = 7.69649534303744e-318;
                    lex(&_l_11,(wstring_view *)local_2e0);
                    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                              ((wstring *)&_l_1,L"$",&local_311);
                    mjs::token::token((token *)local_2e0,identifier,(wstring *)&_l_1);
                    local_2b8.type_ = whitespace;
                    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                              ((wstring *)&_l,L"_",&local_312);
                    mjs::token::token(&local_290,identifier,(wstring *)&_l);
                    local_268 = 0;
                    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                              ((wstring *)&_r,L"$foo2_",&local_313);
                    mjs::token::token(&local_240,identifier,(wstring *)&_r);
                    __l_11._M_len = 5;
                    __l_11._M_array = (iterator)local_2e0;
                    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                              (&_r_11,__l_11,&local_314);
                    lVar5 = 0xa0;
                    do {
                      mjs::token::destroy((token *)(local_2e0 + lVar5));
                      lVar5 = lVar5 + -0x28;
                    } while (lVar5 != -0x28);
                    std::__cxx11::wstring::~wstring((wstring *)&_r);
                    std::__cxx11::wstring::~wstring((wstring *)&_l);
                    std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                    bVar1 = std::operator!=(&_l_11,&_r_11);
                    if (bVar1) {
                      pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                      pwVar3 = std::operator<<(pwVar3," in ");
                      pwVar3 = std::operator<<(pwVar3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                              );
                      pwVar3 = std::operator<<(pwVar3,":");
                      pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x49);
                      pwVar3 = std::operator<<(pwVar3,":\n");
                      pwVar3 = std::operator<<(pwVar3,"lex(L\"$ _ $foo2_\")");
                      pwVar3 = std::operator<<(pwVar3," != ");
                      pwVar3 = std::operator<<(pwVar3,
                                               "TOKENS(token{token_type::identifier, L\"$\"}, token{token_type::whitespace}, token{token_type::identifier, L\"_\"}, token{token_type::whitespace}, token{token_type::identifier, L\"$foo2_\"})"
                                              );
                      pwVar3 = std::operator<<(pwVar3,"\n");
                      pbVar4 = operator<<(pwVar3,&_l_11);
                      pwVar3 = std::operator<<(pbVar4," != ");
                      pbVar4 = operator<<(pwVar3,&_r_11);
                      pwVar3 = std::operator<<(pbVar4,"\n");
                      vVar2 = tested_version();
                      pbVar4 = mjs::operator<<(pwVar3,vVar2);
                      std::operator<<(pbVar4,"\n");
                    }
                    else {
                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r_11);
                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_11);
                      local_2e0 = (undefined1  [8])0x2;
                      local_2d8.dvalue_ = 7.69675225717328e-318;
                      lex(&_l,(wstring_view *)local_2e0);
                      local_2e0._0_4_ = 3;
                      local_2d8.ivalue_ = 0x3ff0000000000000;
                      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                                ((wstring *)&_l_1,L"a",(allocator<wchar_t> *)&_l_11);
                      mjs::token::token(&local_2b8,identifier,(wstring *)&_l_1);
                      __l_12._M_len = 2;
                      __l_12._M_array = (iterator)local_2e0;
                      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                (&_r,__l_12,(allocator_type *)&_r_11);
                      lVar5 = 0x28;
                      do {
                        mjs::token::destroy((token *)(local_2e0 + lVar5));
                        lVar5 = lVar5 + -0x28;
                      } while (lVar5 != -0x28);
                      std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                      bVar1 = std::operator!=(&_l,&_r);
                      if (bVar1) {
                        pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                        pwVar3 = std::operator<<(pwVar3," in ");
                        pwVar3 = std::operator<<(pwVar3,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                );
                        pwVar3 = std::operator<<(pwVar3,":");
                        pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x4a);
                        pwVar3 = std::operator<<(pwVar3,":\n");
                        pwVar3 = std::operator<<(pwVar3,"lex(L\"1a\")");
                        pwVar3 = std::operator<<(pwVar3," != ");
                        pwVar3 = std::operator<<(pwVar3,
                                                 "TOKENS(token{1.}, token{token_type::identifier, L\"a\"})"
                                                );
                        pwVar3 = std::operator<<(pwVar3,"\n");
                        pbVar4 = operator<<(pwVar3,&_l);
                        pwVar3 = std::operator<<(pbVar4," != ");
                        pbVar4 = operator<<(pwVar3,&_r);
                        pwVar3 = std::operator<<(pbVar4,"\n");
                        vVar2 = tested_version();
                        pbVar4 = mjs::operator<<(pwVar3,vVar2);
                        std::operator<<(pbVar4,"\n");
                      }
                      else {
                        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
                        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                        local_2e0 = (undefined1  [8])0x6;
                        local_2d8.dvalue_ = 7.69681154505078e-318;
                        lex(&_l_1,(wstring_view *)local_2e0);
                        local_2e0._0_4_ = 0x13;
                        local_2b8.type_ = rshiftshiftequal;
                        __l_13._M_len = 2;
                        __l_13._M_array = (iterator)local_2e0;
                        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                  (&_l,__l_13,(allocator_type *)&_r);
                        lVar5 = 0x28;
                        do {
                          mjs::token::destroy((token *)(local_2e0 + lVar5));
                          lVar5 = lVar5 + -0x28;
                        } while (lVar5 != -0x28);
                        bVar1 = std::operator!=(&_l_1,&_l);
                        if (bVar1) {
                          pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                          pwVar3 = std::operator<<(pwVar3," in ");
                          pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                          pwVar3 = std::operator<<(pwVar3,":");
                          pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x4c);
                          pwVar3 = std::operator<<(pwVar3,":\n");
                          pwVar3 = std::operator<<(pwVar3,"lex(LR\"(<<>>>=)\")");
                          pwVar3 = std::operator<<(pwVar3," != ");
                          pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::lshift}, token{token_type::rshiftshiftequal})"
                                                  );
                          pwVar3 = std::operator<<(pwVar3,"\n");
                          pbVar4 = operator<<(pwVar3,&_l_1);
                          pwVar3 = std::operator<<(pbVar4," != ");
                          pbVar4 = operator<<(pwVar3,&_l);
                          pwVar3 = std::operator<<(pbVar4,"\n");
                          vVar2 = tested_version();
                          pbVar4 = mjs::operator<<(pwVar3,vVar2);
                          std::operator<<(pbVar4,"\n");
                        }
                        else {
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                          vVar2 = tested_version();
                          tVar6 = equal;
                          if (vVar2 == es1) {
                            local_2e0 = (undefined1  [8])0x7;
                            local_2d8.dvalue_ = 7.69694988343161e-318;
                            lex(&_l_1,(wstring_view *)local_2e0);
                            local_2e0._0_4_ = 0x1d;
                            local_2b8.type_ = whitespace;
                            local_268 = 0;
                            local_240.type_ = equalequal;
                            __l_16._M_len = 6;
                            __l_16._M_array = (iterator)local_2e0;
                            local_290.type_ = tVar6;
                            local_218 = tVar6;
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                      (&_l,__l_16,(allocator_type *)&_r);
                            lVar5 = 200;
                            do {
                              mjs::token::destroy((token *)(local_2e0 + lVar5));
                              lVar5 = lVar5 + -0x28;
                            } while (lVar5 != -0x28);
                            bVar1 = std::operator!=(&_l_1,&_l);
                            if (bVar1) {
                              pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                              pwVar3 = std::operator<<(pwVar3," in ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,":");
                              pwVar3 = (wostream *)
                                       std::wostream::operator<<((wostream *)pwVar3,0x4e);
                              pwVar3 = std::operator<<(pwVar3,":\n");
                              pwVar3 = std::operator<<(pwVar3,"lex(LR\"(= = ===)\")");
                              pwVar3 = std::operator<<(pwVar3," != ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::equal}, token{token_type::whitespace}, token{token_type::equal}, token{token_type::whitespace}, token{token_type::equalequal}, token{token_type::equal})"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,"\n");
                              pbVar4 = operator<<(pwVar3,&_l_1);
                              pwVar3 = std::operator<<(pbVar4," != ");
                              pbVar4 = operator<<(pwVar3,&_l);
                              pwVar3 = std::operator<<(pbVar4,"\n");
                              vVar2 = tested_version();
                              pbVar4 = mjs::operator<<(pwVar3,vVar2);
                              std::operator<<(pbVar4,"\n");
                              goto LAB_001164d0;
                            }
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                            local_2e0 = (undefined1  [8])0x3;
                            local_2d8.dvalue_ = 7.69710798443828e-318;
                            lex(&_l_1,(wstring_view *)local_2e0);
                            local_2e0._0_4_ = 0xc;
                            local_2b8.type_ = equal;
                            __l_17._M_len = 2;
                            __l_17._M_array = (iterator)local_2e0;
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                      (&_l,__l_17,(allocator_type *)&_r);
                            lVar5 = 0x28;
                            do {
                              mjs::token::destroy((token *)(local_2e0 + lVar5));
                              lVar5 = lVar5 + -0x28;
                            } while (lVar5 != -0x28);
                            bVar1 = std::operator!=(&_l_1,&_l);
                            if (bVar1) {
                              pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                              pwVar3 = std::operator<<(pwVar3," in ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,":");
                              pwVar3 = (wostream *)
                                       std::wostream::operator<<((wostream *)pwVar3,0x4f);
                              pwVar3 = std::operator<<(pwVar3,":\n");
                              pwVar3 = std::operator<<(pwVar3,"lex(LR\"(!==)\")");
                              pwVar3 = std::operator<<(pwVar3," != ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::notequal}, token{token_type::equal})"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,"\n");
                              pbVar4 = operator<<(pwVar3,&_l_1);
                              pwVar3 = std::operator<<(pbVar4," != ");
                              pbVar4 = operator<<(pwVar3,&_l);
                              pwVar3 = std::operator<<(pbVar4,"\n");
                              vVar2 = tested_version();
                              pbVar4 = mjs::operator<<(pwVar3,vVar2);
                              std::operator<<(pbVar4,"\n");
                              goto LAB_001164d0;
                            }
                          }
                          else {
                            local_2e0 = (undefined1  [8])0x7;
                            local_2d8.dvalue_ = 7.69694988343161e-318;
                            lex(&_l_1,(wstring_view *)local_2e0);
                            local_2e0._0_4_ = 0x1d;
                            local_2b8.type_ = whitespace;
                            local_268 = 0;
                            local_240.type_ = equalequalequal;
                            __l_14._M_len = 5;
                            __l_14._M_array = (iterator)local_2e0;
                            local_290.type_ = tVar6;
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                      (&_l,__l_14,(allocator_type *)&_r);
                            lVar5 = 0xa0;
                            do {
                              mjs::token::destroy((token *)(local_2e0 + lVar5));
                              lVar5 = lVar5 + -0x28;
                            } while (lVar5 != -0x28);
                            bVar1 = std::operator!=(&_l_1,&_l);
                            if (bVar1) {
                              pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                              pwVar3 = std::operator<<(pwVar3," in ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,":");
                              pwVar3 = (wostream *)
                                       std::wostream::operator<<((wostream *)pwVar3,0x52);
                              pwVar3 = std::operator<<(pwVar3,":\n");
                              pwVar3 = std::operator<<(pwVar3,"lex(LR\"(= = ===)\")");
                              pwVar3 = std::operator<<(pwVar3," != ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::equal}, token{token_type::whitespace}, token{token_type::equal}, token{token_type::whitespace}, token{token_type::equalequalequal})"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,"\n");
                              pbVar4 = operator<<(pwVar3,&_l_1);
                              pwVar3 = std::operator<<(pbVar4," != ");
                              pbVar4 = operator<<(pwVar3,&_l);
                              pwVar3 = std::operator<<(pbVar4,"\n");
                              vVar2 = tested_version();
                              pbVar4 = mjs::operator<<(pwVar3,vVar2);
                              std::operator<<(pbVar4,"\n");
                              goto LAB_001164d0;
                            }
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                            local_2e0 = (undefined1  [8])0x3;
                            local_2d8.dvalue_ = 7.69710798443828e-318;
                            lex(&_l_1,(wstring_view *)local_2e0);
                            local_2e0._0_4_ = 10;
                            __l_15._M_len = 1;
                            __l_15._M_array = (iterator)local_2e0;
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                      (&_l,__l_15,(allocator_type *)&_r);
                            mjs::token::destroy((token *)local_2e0);
                            bVar1 = std::operator!=(&_l_1,&_l);
                            if (bVar1) {
                              pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                              pwVar3 = std::operator<<(pwVar3," in ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,":");
                              pwVar3 = (wostream *)
                                       std::wostream::operator<<((wostream *)pwVar3,0x53);
                              pwVar3 = std::operator<<(pwVar3,":\n");
                              pwVar3 = std::operator<<(pwVar3,"lex(LR\"(!==)\")");
                              pwVar3 = std::operator<<(pwVar3," != ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::notequalequal})");
                              pwVar3 = std::operator<<(pwVar3,"\n");
                              pbVar4 = operator<<(pwVar3,&_l_1);
                              pwVar3 = std::operator<<(pbVar4," != ");
                              pbVar4 = operator<<(pwVar3,&_l);
                              pwVar3 = std::operator<<(pbVar4,"\n");
                              vVar2 = tested_version();
                              pbVar4 = mjs::operator<<(pwVar3,vVar2);
                              std::operator<<(pbVar4,"\n");
                              goto LAB_001164d0;
                            }
                          }
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                          local_2e0 = (undefined1  [8])0x4;
                          local_2d8.dvalue_ = 7.69718703494162e-318;
                          lex(&_l_1,(wstring_view *)local_2e0);
                          local_2e0._0_4_ = 0x5a;
                          __l_18._M_len = 1;
                          __l_18._M_array = (iterator)local_2e0;
                          std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                    (&_l,__l_18,(allocator_type *)&_r);
                          mjs::token::destroy((token *)local_2e0);
                          bVar1 = std::operator!=(&_l_1,&_l);
                          if (bVar1) {
                            pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                            pwVar3 = std::operator<<(pwVar3," in ");
                            pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                            pwVar3 = std::operator<<(pwVar3,":");
                            pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0x57);
                            pwVar3 = std::operator<<(pwVar3,":\n");
                            pwVar3 = std::operator<<(pwVar3,"lex(LR\"(null)\")");
                            pwVar3 = std::operator<<(pwVar3," != ");
                            pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::null_})");
                            pwVar3 = std::operator<<(pwVar3,"\n");
                            pbVar4 = operator<<(pwVar3,&_l_1);
                            pwVar3 = std::operator<<(pbVar4," != ");
                            pbVar4 = operator<<(pwVar3,&_l);
                            pwVar3 = std::operator<<(pbVar4,"\n");
                            vVar2 = tested_version();
                            pbVar4 = mjs::operator<<(pwVar3,vVar2);
                            std::operator<<(pbVar4,"\n");
                          }
                          else {
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                            local_2e0 = (undefined1  [8])0x4;
                            local_2d8.dvalue_ = 7.69728584807078e-318;
                            lex(&_l_1,(wstring_view *)local_2e0);
                            local_2e0._0_4_ = 0x69;
                            __l_19._M_len = 1;
                            __l_19._M_array = (iterator)local_2e0;
                            std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                      (&_l,__l_19,(allocator_type *)&_r);
                            mjs::token::destroy((token *)local_2e0);
                            bVar1 = std::operator!=(&_l_1,&_l);
                            if (bVar1) {
                              pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                              pwVar3 = std::operator<<(pwVar3," in ");
                              pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                              pwVar3 = std::operator<<(pwVar3,":");
                              pwVar3 = (wostream *)
                                       std::wostream::operator<<((wostream *)pwVar3,0x59);
                              pwVar3 = std::operator<<(pwVar3,":\n");
                              pwVar3 = std::operator<<(pwVar3,"lex(LR\"(true)\")");
                              pwVar3 = std::operator<<(pwVar3," != ");
                              pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::true_})");
                              pwVar3 = std::operator<<(pwVar3,"\n");
                              pbVar4 = operator<<(pwVar3,&_l_1);
                              pwVar3 = std::operator<<(pbVar4," != ");
                              pbVar4 = operator<<(pwVar3,&_l);
                              pwVar3 = std::operator<<(pbVar4,"\n");
                              vVar2 = tested_version();
                              pbVar4 = mjs::operator<<(pwVar3,vVar2);
                              std::operator<<(pbVar4,"\n");
                            }
                            else {
                              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                              std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1);
                              local_2e0 = (undefined1  [8])0x5;
                              local_2d8.dvalue_ = 7.69738466119995e-318;
                              lex(&_l_1,(wstring_view *)local_2e0);
                              local_2e0._0_4_ = 0x48;
                              __l_20._M_len = 1;
                              __l_20._M_array = (iterator)local_2e0;
                              std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                        (&_l,__l_20,(allocator_type *)&_r);
                              mjs::token::destroy((token *)local_2e0);
                              bVar1 = std::operator!=(&_l_1,&_l);
                              if (bVar1) {
                                pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                                pwVar3 = std::operator<<(pwVar3," in ");
                                pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                pwVar3 = std::operator<<(pwVar3,":");
                                pwVar3 = (wostream *)
                                         std::wostream::operator<<((wostream *)pwVar3,0x5a);
                                pwVar3 = std::operator<<(pwVar3,":\n");
                                pwVar3 = std::operator<<(pwVar3,"lex(LR\"(false)\")");
                                pwVar3 = std::operator<<(pwVar3," != ");
                                pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::false_})")
                                ;
                                pwVar3 = std::operator<<(pwVar3,"\n");
                                pbVar4 = operator<<(pwVar3,&_l_1);
                                pwVar3 = std::operator<<(pbVar4," != ");
                                pbVar4 = operator<<(pwVar3,&_l);
                                pwVar3 = std::operator<<(pbVar4,"\n");
                                vVar2 = tested_version();
                                pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                std::operator<<(pbVar4,"\n");
                              }
                              else {
                                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
                                std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l_1)
                                ;
                                local_2e0 = (undefined1  [8])0x2;
                                local_2d8.dvalue_ = 7.69750323695495e-318;
                                lex(&_l_1,(wstring_view *)local_2e0);
                                local_2e0._0_4_ = 3;
                                local_2d8.ivalue_ = 0x404e000000000000;
                                __l_21._M_len = 1;
                                __l_21._M_array = (iterator)local_2e0;
                                std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                          (&_l,__l_21,(allocator_type *)&_r);
                                mjs::token::destroy((token *)local_2e0);
                                bVar1 = std::operator!=(&_l_1,&_l);
                                if (bVar1) {
                                  pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                                  pwVar3 = std::operator<<(pwVar3," in ");
                                  pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                  pwVar3 = std::operator<<(pwVar3,":");
                                  pwVar3 = (wostream *)
                                           std::wostream::operator<<((wostream *)pwVar3,0x5c);
                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                  pwVar3 = std::operator<<(pwVar3,"lex(LR\"(60)\")");
                                  pwVar3 = std::operator<<(pwVar3," != ");
                                  pwVar3 = std::operator<<(pwVar3,"TOKENS(token{60.})");
                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                  pbVar4 = operator<<(pwVar3,&_l_1);
                                  pwVar3 = std::operator<<(pbVar4," != ");
                                  pbVar4 = operator<<(pwVar3,&_l);
                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                  vVar2 = tested_version();
                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                  std::operator<<(pbVar4,"\n");
                                }
                                else {
                                  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l)
                                  ;
                                  std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                            (&_l_1);
                                  local_2e0 = (undefined1  [8])0x7;
                                  local_2d8.dvalue_ = 7.69756252483245e-318;
                                  lex(&_l_1,(wstring_view *)local_2e0);
                                  local_2e0._0_4_ = 3;
                                  local_2d8.ivalue_ = 0x405ec7df3b645a1d;
                                  __l_22._M_len = 1;
                                  __l_22._M_array = (iterator)local_2e0;
                                  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                            (&_l,__l_22,(allocator_type *)&_r);
                                  mjs::token::destroy((token *)local_2e0);
                                  bVar1 = std::operator!=(&_l_1,&_l);
                                  if (bVar1) {
                                    pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests");
                                    pwVar3 = std::operator<<(pwVar3," in ");
                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                    pwVar3 = std::operator<<(pwVar3,":");
                                    pwVar3 = (wostream *)
                                             std::wostream::operator<<((wostream *)pwVar3,0x5d);
                                    pwVar3 = std::operator<<(pwVar3,":\n");
                                    pwVar3 = std::operator<<(pwVar3,"lex(LR\"(123.123)\")");
                                    pwVar3 = std::operator<<(pwVar3," != ");
                                    pwVar3 = std::operator<<(pwVar3,"TOKENS(token{123.123})");
                                    pwVar3 = std::operator<<(pwVar3,"\n");
                                    pbVar4 = operator<<(pwVar3,&_l_1);
                                    pwVar3 = std::operator<<(pbVar4," != ");
                                    pbVar4 = operator<<(pwVar3,&_l);
                                    pwVar3 = std::operator<<(pbVar4,"\n");
                                    vVar2 = tested_version();
                                    pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                    std::operator<<(pbVar4,"\n");
                                  }
                                  else {
                                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                              (&_l);
                                    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                              (&_l_1);
                                    local_2e0 = (undefined1  [8])0x6;
                                    local_2d8.dvalue_ = 7.69772062583912e-318;
                                    lex(&_l_1,(wstring_view *)local_2e0);
                                    local_2e0._0_4_ = 3;
                                    local_2d8.ivalue_ = 0x7ff0000000000000;
                                    __l_23._M_len = 1;
                                    __l_23._M_array = (iterator)local_2e0;
                                    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                              (&_l,__l_23,(allocator_type *)&_r);
                                    mjs::token::destroy((token *)local_2e0);
                                    bVar1 = std::operator!=(&_l_1,&_l);
                                    if (bVar1) {
                                      pwVar3 = std::operator<<((wostream *)&std::wcerr,"basic_tests"
                                                              );
                                      pwVar3 = std::operator<<(pwVar3," in ");
                                      pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                      pwVar3 = std::operator<<(pwVar3,":");
                                      pwVar3 = (wostream *)
                                               std::wostream::operator<<((wostream *)pwVar3,0x5e);
                                      pwVar3 = std::operator<<(pwVar3,":\n");
                                      pwVar3 = std::operator<<(pwVar3,"lex(LR\"(1E+309)\")");
                                      pwVar3 = std::operator<<(pwVar3," != ");
                                      pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{(__builtin_inff ())})");
                                      pwVar3 = std::operator<<(pwVar3,"\n");
                                      pbVar4 = operator<<(pwVar3,&_l_1);
                                      pwVar3 = std::operator<<(pbVar4," != ");
                                      pbVar4 = operator<<(pwVar3,&_l);
                                      pwVar3 = std::operator<<(pbVar4,"\n");
                                      vVar2 = tested_version();
                                      pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                      std::operator<<(pbVar4,"\n");
                                    }
                                    else {
                                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                                (&_l);
                                      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
                                                (&_l_1);
                                      local_2e0 = (undefined1  [8])0x6;
                                      local_2d8.dvalue_ = 7.69785896421996e-318;
                                      lex(&_l_1,(wstring_view *)local_2e0);
                                      local_2e0._0_4_ = 3;
                                      local_2d8.ivalue_ = 2;
                                      __l_24._M_len = 1;
                                      __l_24._M_array = (iterator)local_2e0;
                                      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                                (&_l,__l_24,(allocator_type *)&_r);
                                      mjs::token::destroy((token *)local_2e0);
                                      bVar1 = std::operator!=(&_l_1,&_l);
                                      if (bVar1) {
                                        pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                 "basic_tests");
                                        pwVar3 = std::operator<<(pwVar3," in ");
                                        pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                        pwVar3 = std::operator<<(pwVar3,":");
                                        pwVar3 = (wostream *)
                                                 std::wostream::operator<<((wostream *)pwVar3,0x5f);
                                        pwVar3 = std::operator<<(pwVar3,":\n");
                                        pwVar3 = std::operator<<(pwVar3,"lex(LR\"(1E-323)\")");
                                        pwVar3 = std::operator<<(pwVar3," != ");
                                        pwVar3 = std::operator<<(pwVar3,"TOKENS(token{1e-323})");
                                        pwVar3 = std::operator<<(pwVar3,"\n");
                                        pbVar4 = operator<<(pwVar3,&_l_1);
                                        pwVar3 = std::operator<<(pbVar4," != ");
                                        pbVar4 = operator<<(pwVar3,&_l);
                                        pwVar3 = std::operator<<(pbVar4,"\n");
                                        vVar2 = tested_version();
                                        pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                        std::operator<<(pbVar4,"\n");
                                      }
                                      else {
                                        std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                        ~vector(&_l);
                                        std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                        ~vector(&_l_1);
                                        local_2e0 = (undefined1  [8])0x6;
                                        local_2d8.dvalue_ = 7.6979973026008e-318;
                                        lex(&_l_1,(wstring_view *)local_2e0);
                                        local_2e0._0_4_ = 3;
                                        local_2d8.ivalue_ = 0;
                                        __l_25._M_len = 1;
                                        __l_25._M_array = (iterator)local_2e0;
                                        std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
                                                  (&_l,__l_25,(allocator_type *)&_r);
                                        mjs::token::destroy((token *)local_2e0);
                                        bVar1 = std::operator!=(&_l_1,&_l);
                                        if (bVar1) {
                                          pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                   "basic_tests");
                                          pwVar3 = std::operator<<(pwVar3," in ");
                                          pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                          pwVar3 = std::operator<<(pwVar3,":");
                                          pwVar3 = (wostream *)
                                                   std::wostream::operator<<
                                                             ((wostream *)pwVar3,0x60);
                                          pwVar3 = std::operator<<(pwVar3,":\n");
                                          pwVar3 = std::operator<<(pwVar3,"lex(LR\"(1E-324)\")");
                                          pwVar3 = std::operator<<(pwVar3," != ");
                                          pwVar3 = std::operator<<(pwVar3,"TOKENS(token{0})");
                                          pwVar3 = std::operator<<(pwVar3,"\n");
                                          pbVar4 = operator<<(pwVar3,&_l_1);
                                          pwVar3 = std::operator<<(pbVar4," != ");
                                          pbVar4 = operator<<(pwVar3,&_l);
                                          pwVar3 = std::operator<<(pbVar4,"\n");
                                          vVar2 = tested_version();
                                          pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                          std::operator<<(pbVar4,"\n");
                                        }
                                        else {
                                          std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                          ~vector(&_l);
                                          std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                          ~vector(&_l_1);
                                          local_2e0 = (undefined1  [8])0x5;
                                          local_2d8.dvalue_ = 7.69813564098163e-318;
                                          lex(&_l_1,(wstring_view *)local_2e0);
                                          local_2e0._0_4_ = 3;
                                          local_2d8.ivalue_ = 0x4045200000000000;
                                          __l_26._M_len = 1;
                                          __l_26._M_array = (iterator)local_2e0;
                                          std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                          vector(&_l,__l_26,(allocator_type *)&_r);
                                          mjs::token::destroy((token *)local_2e0);
                                          bVar1 = std::operator!=(&_l_1,&_l);
                                          if (bVar1) {
                                            pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                     "basic_tests");
                                            pwVar3 = std::operator<<(pwVar3," in ");
                                            pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                            pwVar3 = std::operator<<(pwVar3,":");
                                            pwVar3 = (wostream *)
                                                     std::wostream::operator<<
                                                               ((wostream *)pwVar3,0x61);
                                            pwVar3 = std::operator<<(pwVar3,":\n");
                                            pwVar3 = std::operator<<(pwVar3,"lex(LR\"(42.25)\")");
                                            pwVar3 = std::operator<<(pwVar3," != ");
                                            pwVar3 = std::operator<<(pwVar3,"TOKENS(token{42.25})");
                                            pwVar3 = std::operator<<(pwVar3,"\n");
                                            pbVar4 = operator<<(pwVar3,&_l_1);
                                            pwVar3 = std::operator<<(pbVar4," != ");
                                            pbVar4 = operator<<(pwVar3,&_l);
                                            pwVar3 = std::operator<<(pbVar4,"\n");
                                            vVar2 = tested_version();
                                            pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                            std::operator<<(pbVar4,"\n");
                                          }
                                          else {
                                            std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                            ~vector(&_l);
                                            std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                            ~vector(&_l_1);
                                            local_2e0 = (undefined1  [8])0x6;
                                            local_2d8.dvalue_ = 7.69825421673663e-318;
                                            lex(&_l_1,(wstring_view *)local_2e0);
                                            local_2e0._0_4_ = 3;
                                            local_2d8.ivalue_ = 0x405bc00000000000;
                                            __l_27._M_len = 1;
                                            __l_27._M_array = (iterator)local_2e0;
                                            std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                            vector(&_l,__l_27,(allocator_type *)&_r);
                                            mjs::token::destroy((token *)local_2e0);
                                            bVar1 = std::operator!=(&_l_1,&_l);
                                            if (bVar1) {
                                              pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                       "basic_tests");
                                              pwVar3 = std::operator<<(pwVar3," in ");
                                              pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                              pwVar3 = std::operator<<(pwVar3,":");
                                              pwVar3 = (wostream *)
                                                       std::wostream::operator<<
                                                                 ((wostream *)pwVar3,0x62);
                                              pwVar3 = std::operator<<(pwVar3,":\n");
                                              pwVar3 = std::operator<<(pwVar3,"lex(LR\"(1.11e2)\")")
                                              ;
                                              pwVar3 = std::operator<<(pwVar3," != ");
                                              pwVar3 = std::operator<<(pwVar3,"TOKENS(token{111})");
                                              pwVar3 = std::operator<<(pwVar3,"\n");
                                              pbVar4 = operator<<(pwVar3,&_l_1);
                                              pwVar3 = std::operator<<(pbVar4," != ");
                                              pbVar4 = operator<<(pwVar3,&_l);
                                              pwVar3 = std::operator<<(pbVar4,"\n");
                                              vVar2 = tested_version();
                                              pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                              std::operator<<(pbVar4,"\n");
                                            }
                                            else {
                                              std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                              ~vector(&_l);
                                              std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                              ~vector(&_l_1);
                                              local_2e0 = (undefined1  [8])0x5;
                                              local_2d8.dvalue_ = 7.69839255511747e-318;
                                              lex(&_l_1,(wstring_view *)local_2e0);
                                              local_2e0._0_4_ = 3;
                                              local_2d8.ivalue_ = 0x4070000000000000;
                                              __l_28._M_len = 1;
                                              __l_28._M_array = (iterator)local_2e0;
                                              std::vector<mjs::token,_std::allocator<mjs::token>_>::
                                              vector(&_l,__l_28,(allocator_type *)&_r);
                                              mjs::token::destroy((token *)local_2e0);
                                              bVar1 = std::operator!=(&_l_1,&_l);
                                              if (bVar1) {
                                                pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                         "basic_tests");
                                                pwVar3 = std::operator<<(pwVar3," in ");
                                                pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                pwVar3 = std::operator<<(pwVar3,":");
                                                pwVar3 = (wostream *)
                                                         std::wostream::operator<<
                                                                   ((wostream *)pwVar3,99);
                                                pwVar3 = std::operator<<(pwVar3,":\n");
                                                pwVar3 = std::operator<<(pwVar3,"lex(LR\"(0x100)\")"
                                                                        );
                                                pwVar3 = std::operator<<(pwVar3," != ");
                                                pwVar3 = std::operator<<(pwVar3,"TOKENS(token{256})"
                                                                        );
                                                pwVar3 = std::operator<<(pwVar3,"\n");
                                                pbVar4 = operator<<(pwVar3,&_l_1);
                                                pwVar3 = std::operator<<(pbVar4," != ");
                                                pbVar4 = operator<<(pwVar3,&_l);
                                                pwVar3 = std::operator<<(pbVar4,"\n");
                                                vVar2 = tested_version();
                                                pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                std::operator<<(pbVar4,"\n");
                                              }
                                              else {
                                                std::vector<mjs::token,_std::allocator<mjs::token>_>
                                                ::~vector(&_l);
                                                std::vector<mjs::token,_std::allocator<mjs::token>_>
                                                ::~vector(&_l_1);
                                                local_2e0 = (undefined1  [8])0x4;
                                                local_2d8.dvalue_ = 7.69851113087247e-318;
                                                lex(&_l_1,(wstring_view *)local_2e0);
                                                local_2e0._0_4_ = 3;
                                                local_2d8.ivalue_ = 0x4054c00000000000;
                                                __l_29._M_len = 1;
                                                __l_29._M_array = (iterator)local_2e0;
                                                std::vector<mjs::token,_std::allocator<mjs::token>_>
                                                ::vector(&_l,__l_29,(allocator_type *)&_r);
                                                mjs::token::destroy((token *)local_2e0);
                                                bVar1 = std::operator!=(&_l_1,&_l);
                                                if (bVar1) {
                                                  pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar3 = std::operator<<(pwVar3," in ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,100);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(0123)\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{83})");
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l_1);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                }
                                                else {
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l_1);
                                                  local_2e0 = (undefined1  [8])0xd;
                                                  local_2d8.dvalue_ = 7.69860994400164e-318;
                                                  lex(&_l,(wstring_view *)local_2e0);
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"test \"\" str",
                                                             (allocator<wchar_t> *)&_l_11);
                                                  mjs::token::token((token *)local_2e0,
                                                                    string_literal,(wstring *)&_l_1)
                                                  ;
                                                  __l_30._M_len = 1;
                                                  __l_30._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_30,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x66);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(\'test \"\" str\')\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"test \\\"\\\" str\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  else {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  local_2e0 = (undefined1  [8])0xc;
                                                  local_2d8.dvalue_ = 7.69912377227331e-318;
                                                  lex(&_l,(wstring_view *)local_2e0);
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"blahblah\'\'",
                                                             (allocator<wchar_t> *)&_l_11);
                                                  mjs::token::token((token *)local_2e0,
                                                                    string_literal,(wstring *)&_l_1)
                                                  ;
                                                  __l_31._M_len = 1;
                                                  __l_31._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_31,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x67);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(\"blahblah\'\'\")\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"blahblah\'\'\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  else {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  local_2e0 = (undefined1  [8])0x12;
                                                  local_2d8.dvalue_ = 7.69959807529332e-318;
                                                  lex(&_l,(wstring_view *)local_2e0);
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"\'\"\\\b\f\n\r\t",
                                                             (allocator<wchar_t> *)&_l_11);
                                                  mjs::token::token((token *)local_2e0,
                                                                    string_literal,(wstring *)&_l_1)
                                                  ;
                                                  __l_32._M_len = 1;
                                                  __l_32._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_32,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x69);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(\'\\\'\\\"\\\\\\b\\f\\n\\r\\t\')\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"\\\'\\\"\\\\\\b\\f\\n\\r\\t\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  else {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  local_2e0 = (undefined1  [8])0x3;
                                                  local_2d8.dvalue_ = 7.70015142881666e-318;
                                                  check_lex_fails_abi_cxx11_
                                                            (&local_48,(wstring_view *)local_2e0);
                                                  std::__cxx11::string::~string((string *)&local_48)
                                                  ;
                                                  vVar2 = tested_version();
                                                  if ((int)vVar2 < 2) {
                                                    local_2e0 = (undefined1  [8])0xd;
                                                    local_2d8.dvalue_ = 7.70023047932e-318;
                                                    check_lex_fails_abi_cxx11_
                                                              (&local_68,(wstring_view *)local_2e0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_68);
                                                  }
                                                  else {
                                                    local_2e0 = (undefined1  [8])0xd;
                                                    local_2d8.dvalue_ = 7.70023047932e-318;
                                                    lex(&_l,(wstring_view *)local_2e0);
                                                    std::__cxx11::wstring::
                                                    wstring<std::allocator<wchar_t>>
                                                              ((wstring *)&_l_1,L"Testblah!",
                                                               (allocator<wchar_t> *)&_l_11);
                                                    mjs::token::token((token *)local_2e0,
                                                                      string_literal,
                                                                      (wstring *)&_l_1);
                                                    __l_33._M_len = 1;
                                                    __l_33._M_array = (iterator)local_2e0;
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_33,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x72);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(line_continuation)");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"Testblah!\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  goto LAB_001164d0;
                                                  }
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  }
                                                  vVar2 = tested_version();
                                                  if (vVar2 == es1) {
                                                    local_2e0 = (undefined1  [8])0x4;
                                                    local_2d8.dvalue_ = 7.70070478234001e-318;
                                                    check_lex_fails_abi_cxx11_
                                                              (&local_88,(wstring_view *)local_2e0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_88);
                                                  }
                                                  else {
                                                    local_2e0 = (undefined1  [8])0x4;
                                                    local_2d8.dvalue_ = 7.70070478234001e-318;
                                                    lex(&_l,(wstring_view *)local_2e0);
                                                    std::__cxx11::wstring::
                                                    wstring<std::allocator<wchar_t>>
                                                              ((wstring *)&_l_1,L"\v",
                                                               (allocator<wchar_t> *)&_l_11);
                                                    mjs::token::token((token *)local_2e0,
                                                                      string_literal,
                                                                      (wstring *)&_l_1);
                                                    __l_34._M_len = 1;
                                                    __l_34._M_array = (iterator)local_2e0;
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_34,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x7a);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(vert_tab_str)");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"\\x0B\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  goto LAB_001164d0;
                                                  }
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  }
                                                  local_2e0 = (undefined1  [8])0xa;
                                                  local_2d8.dvalue_ = 7.70084312072084e-318;
                                                  lex(&_l,(wstring_view *)local_2e0);
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"«\n",
                                                             (allocator<wchar_t> *)&_l_11);
                                                  mjs::token::token((token *)local_2e0,
                                                                    string_literal,(wstring *)&_l_1)
                                                  ;
                                                  __l_35._M_len = 1;
                                                  __l_35._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_35,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x7d);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(\'\\xAB\\x0A\')\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"\\xAB\\n\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  else {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  local_2e0 = (undefined1  [8])0xf;
                                                  local_2d8.dvalue_ = 7.70111979748251e-318;
                                                  lex(&_l,(wstring_view *)local_2e0);
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"\a?S 0",
                                                             (allocator<wchar_t> *)&_l_11);
                                                  mjs::token::token((token *)local_2e0,
                                                                    string_literal,(wstring *)&_l_1)
                                                  ;
                                                  __l_36._M_len = 1;
                                                  __l_36._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_36,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x7f);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(\'\\7\\77\\123\\400\')\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"\\x07\\x3f\\x53\\x20\\x30\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  else {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  local_2e0 = (undefined1  [8])0x8;
                                                  local_2d8.dvalue_ = 7.70155457525085e-318;
                                                  lex(&_l,(wstring_view *)local_2e0);
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"ሴ",
                                                             (allocator<wchar_t> *)&_l_11);
                                                  mjs::token::token((token *)local_2e0,
                                                                    string_literal,(wstring *)&_l_1)
                                                  ;
                                                  __l_37._M_len = 1;
                                                  __l_37._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r,__l_37,(allocator_type *)&_r_11);
                                                  mjs::token::destroy((token *)local_2e0);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l,&_r);
                                                  if (bVar1) {
                                                    pwVar3 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"basic_tests");
                                                    pwVar3 = std::operator<<(pwVar3," in ");
                                                    pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x81);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(\'\\u1234\')\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::string_literal, L\"\\x1234\"})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  else {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l);
                                                  local_2e0 = (undefined1  [8])0x16;
                                                  local_2d8.dvalue_ = 7.70177196413502e-318;
                                                  lex(&_l_11,(wstring_view *)local_2e0);
                                                  local_2e0._0_4_ = 0x4f;
                                                  local_2b8.type_ = whitespace;
                                                  local_290.type_ = lparen;
                                                  local_268 = 3;
                                                  local_260 = 0x3ff0000000000000;
                                                  local_240.type_ = rparen;
                                                  local_218 = whitespace;
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l_1,L"foo",&local_311);
                                                  mjs::token::token(&local_1f0,identifier,
                                                                    (wstring *)&_l_1);
                                                  local_1c8 = 0x32;
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_l,L"x",&local_312);
                                                  mjs::token::token(&local_1a0,string_literal,
                                                                    (wstring *)&_l);
                                                  local_178 = 0x33;
                                                  local_150 = 0x1d;
                                                  std::__cxx11::wstring::
                                                  wstring<std::allocator<wchar_t>>
                                                            ((wstring *)&_r,L"bar",&local_313);
                                                  mjs::token::token(&local_128,identifier,
                                                                    (wstring *)&_r);
                                                  local_100 = 0x2e;
                                                  local_d8 = 0x2f;
                                                  local_b0 = 0x34;
                                                  __l_38._M_len = 0xf;
                                                  __l_38._M_array = (iterator)local_2e0;
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  vector(&_r_11,__l_38,&local_314);
                                                  lVar5 = 0x230;
                                                  do {
                                                    mjs::token::destroy((token *)(local_2e0 + lVar5)
                                                                       );
                                                    lVar5 = lVar5 + -0x28;
                                                  } while (lVar5 != -0x28);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_r);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l);
                                                  std::__cxx11::wstring::~wstring((wstring *)&_l_1);
                                                  bVar1 = std::operator!=(&_l_11,&_r_11);
                                                  if (!bVar1) {
                                                    std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_r_11);
                                                  std::
                                                  vector<mjs::token,_std::allocator<mjs::token>_>::
                                                  ~vector(&_l_11);
                                                  return;
                                                  }
                                                  pwVar3 = std::operator<<((wostream *)&std::wcerr,
                                                                           "basic_tests");
                                                  pwVar3 = std::operator<<(pwVar3," in ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,":");
                                                  pwVar3 = (wostream *)
                                                           std::wostream::operator<<
                                                                     ((wostream *)pwVar3,0x84);
                                                  pwVar3 = std::operator<<(pwVar3,":\n");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "lex(LR\"(if (1) foo[\'x\']=bar();)\")");
                                                  pwVar3 = std::operator<<(pwVar3," != ");
                                                  pwVar3 = std::operator<<(pwVar3,
                                                  "TOKENS(token{token_type::if_}, token{token_type::whitespace}, token{token_type::lparen}, token{1.}, token{token_type::rparen}, token{token_type::whitespace}, token{token_type::identifier, L\"foo\"}, token{token_type::lbracket}, token{token_type::string_literal, L\"x\"}, token{token_type::rbracket}, token{token_type::equal}, token{token_type::identifier, L\"bar\"}, token{token_type::lparen}, token{token_type::rparen}, token{token_type::semicolon})"
                                                  );
                                                  pwVar3 = std::operator<<(pwVar3,"\n");
                                                  pbVar4 = operator<<(pwVar3,&_l_11);
                                                  pwVar3 = std::operator<<(pbVar4," != ");
                                                  pbVar4 = operator<<(pwVar3,&_r_11);
                                                  pwVar3 = std::operator<<(pbVar4,"\n");
                                                  vVar2 = tested_version();
                                                  pbVar4 = mjs::operator<<(pwVar3,vVar2);
                                                  std::operator<<(pbVar4,"\n");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001164d0:
  abort();
}

Assistant:

void basic_tests() {
    // Whitespace
    SIMPLE_TEST(L"\x09\x0b\x0c\x20 ab", WS, ID("ab"));
    if (tested_version() > version::es1) {
        // <NBSP> + <USP> are considered whitespace in ES3+
        SIMPLE_TEST(L"\xA0\x1680\x2000", WS);
    }
    // Line terminators
    SIMPLE_TEST(L"\012x\015", NL, ID("x"), NL);
    if (tested_version() > version::es1) {
        // In ES3+ \u2028 and \u2029 are considered line terminators
        SIMPLE_TEST(L"\x2028\x2029", NL);
        SIMPLE_TEST(L"x//\x2029", ID("x"), WS, NL);
    }
    // Comments
    SIMPLE_TEST(L"/*hello world!*/", WS);
    SIMPLE_TEST(L"/*hello\nworld!*/", NL);
    SIMPLE_TEST(L"x//test", ID("x"), WS);
    SIMPLE_TEST(L"x//test\n", ID("x"), WS, NL);
    // Reserver word
    SIMPLE_TEST(LR"(for)", T(for_));
    // Identifier
    SIMPLE_TEST(LR"(test)", ID("test"));
    SIMPLE_TEST(L"a b cd", ID("a"), WS, ID("b"), WS, ID("cd"));
    SIMPLE_TEST(L"$ _ $foo2_", ID("$"), WS, ID("_"), WS, ID("$foo2_"));
    SIMPLE_TEST(L"1a", token{1.}, ID("a"));
    // Punctuator
    SIMPLE_TEST(LR"(<<>>>=)", T(lshift), T(rshiftshiftequal));
    if (tested_version() == version::es1) {
        SIMPLE_TEST(LR"(= = ===)", T(equal), WS, T(equal), WS, T(equalequal), T(equal));
        SIMPLE_TEST(LR"(!==)", T(notequal), T(equal));
    } else {
        // ===/ !== are new in ES3
        SIMPLE_TEST(LR"(= = ===)", T(equal), WS, T(equal), WS, T(equalequalequal));
        SIMPLE_TEST(LR"(!==)", T(notequalequal));
    }
    // Literal
    //  - null literal
    SIMPLE_TEST(LR"(null)", T(null_));
    //  - boolean literals
    SIMPLE_TEST(LR"(true)", T(true_));
    SIMPLE_TEST(LR"(false)", T(false_));
    //  - numeric literal
    SIMPLE_TEST(LR"(60)", token{60.});
    SIMPLE_TEST(LR"(123.123)", token{123.123});
    SIMPLE_TEST(LR"(1E+309)", token{INFINITY});
    SIMPLE_TEST(LR"(1E-323)", token{1e-323});
    SIMPLE_TEST(LR"(1E-324)", token{0});
    SIMPLE_TEST(LR"(42.25)", token{42.25});
    SIMPLE_TEST(LR"(1.11e2)", token{111});
    SIMPLE_TEST(LR"(0x100)", token{256});
    SIMPLE_TEST(LR"(0123)", token{83});
    //  - string literal
    SIMPLE_TEST(LR"('test "" str')", STR("test \"\" str"));
    SIMPLE_TEST(LR"("blahblah''")", STR("blahblah''"));
    //      SingleEscapeCharacter
    SIMPLE_TEST(LR"('\'\"\\\b\f\n\r\t')", STR("\'\"\\\b\f\n\r\t"));

    check_lex_fails(L"'\n'"); // an unescaped line terminator cannot appear in a string literal in any version

    // Line continutations aren't supported until ES5
    const auto line_continuation = L"'Test\\\nblah!'";
    if (tested_version() < version::es5) {
        check_lex_fails(line_continuation);
    } else {
        SIMPLE_TEST(line_continuation, STR("Testblah!"));
    }

    // Vertical tab (<VT>) supported from es3 on
    const auto vert_tab_str = LR"('\v')";
    if (tested_version() == version::es1) {
        check_lex_fails(vert_tab_str);
    } else {
        SIMPLE_TEST(vert_tab_str, STR("\x0B"));
    }
    //      HexEscapeSequence
    SIMPLE_TEST(LR"('\xAB\x0A')", STR("\xAB\n"));
    //      OctalEscapeSequence
    SIMPLE_TEST(LR"('\7\77\123\400')", STR("\x07\x3f\x53\x20\x30"));
    //      UnicodeEscapeSequence
    SIMPLE_TEST(LR"('\u1234')", STR("\x1234"));

    // A combined example
    SIMPLE_TEST(LR"(if (1) foo['x']=bar();)", T(if_), WS, T(lparen), token{1.}, T(rparen), WS, ID("foo"), T(lbracket), STR("x"), T(rbracket), T(equal), ID("bar"), T(lparen), T(rparen), T(semicolon));
}